

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O1

bool __thiscall ON_PolyCurve::ChangeClosedCurveSeam(ON_PolyCurve *this,double t)

{
  double *pdVar1;
  int iVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  ON_Curve *pOVar9;
  ON_Curve *pOVar10;
  _func_int **extraout_XMM0_Qa;
  _func_int **extraout_XMM0_Qa_00;
  double dVar11;
  ON_Curve **in_XMM1_Qa;
  double *t1;
  double k;
  ON_Interval Segdom;
  ON_Interval old_dom;
  ON_Interval sdom;
  ON_Curve *sright;
  ON_Curve *sleft;
  double local_b0;
  uint local_a4;
  double local_a0;
  int local_94;
  double local_90;
  ON_SimpleArray<double> local_88;
  ON_Interval local_70;
  ON_SimpleArray<ON_Curve_*> local_60;
  ON_Curve *local_48;
  ON_Curve *local_40;
  uint local_34;
  
  local_a0 = t;
  iVar5 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x34])();
  if ((char)iVar5 == '\0') {
    return false;
  }
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x17])(this);
  iVar5 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
  if (iVar5 == 1) {
    if ((this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count < 1) {
      pOVar9 = (ON_Curve *)0x0;
    }
    else {
      pOVar9 = *(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a;
    }
    bVar3 = true;
    if (pOVar9 == (ON_Curve *)0x0) {
      cVar4 = '\0';
      goto LAB_0058f3d8;
    }
    (*(pOVar9->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(pOVar9);
    local_60._vptr_ON_SimpleArray = extraout_XMM0_Qa_00;
    local_60.m_a = in_XMM1_Qa;
    ON_Interval::TransformParameterTo(&local_70,(ON_Interval *)&local_60,local_a0);
    iVar5 = (*(pOVar9->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x27])(pOVar9);
    cVar4 = (char)iVar5;
  }
  else {
    local_b0 = local_a0;
    bVar3 = ON_Interval::Includes(&local_70,local_a0,false);
    if (!bVar3) {
      dVar11 = ON_Interval::NormalizedParameterAt(&local_70,local_a0);
      dVar11 = fmod(dVar11,1.0);
      local_b0 = ON_Interval::ParameterAt
                           (&local_70,
                            (double)(~-(ulong)(dVar11 < 0.0) & (ulong)dVar11 |
                                    (ulong)(dVar11 + 1.0) & -(ulong)(dVar11 < 0.0)));
    }
    bVar3 = ON_Interval::Includes(&local_70,local_b0,true);
    cVar4 = '\x01';
    if (bVar3) {
      iVar7 = iVar5 + 1;
      bVar3 = false;
      uVar6 = ON_NurbsSpanIndex(2,iVar7,(this->m_t).m_a,local_b0,0,0);
      lVar8 = (long)(int)uVar6;
      pdVar1 = (this->m_t).m_a;
      dVar11 = pdVar1[lVar8];
      cVar4 = '\0';
      if (dVar11 <= local_b0) {
        bVar3 = false;
        cVar4 = '\0';
        if (local_b0 < pdVar1[lVar8 + 1]) {
          cVar4 = '\0';
          pOVar9 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[lVar8];
          iVar2 = iVar5;
          if (local_b0 != dVar11) {
            iVar2 = iVar7;
          }
          if (NAN(local_b0) || NAN(dVar11)) {
            iVar2 = iVar7;
          }
          local_40 = (ON_Curve *)0x0;
          local_48 = (ON_Curve *)0x0;
          local_a4 = uVar6;
          if ((local_b0 != dVar11) || (NAN(local_b0) || NAN(dVar11))) {
            t1 = (double *)pdVar1[lVar8 + 1];
            local_94 = iVar2;
            local_34 = uVar6;
            ON_Interval::ON_Interval((ON_Interval *)&local_60,pdVar1[lVar8],(double)t1);
            local_90 = ON_Interval::NormalizedParameterAt((ON_Interval *)&local_60,local_b0);
            (*(pOVar9->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(pOVar9);
            local_88._vptr_ON_SimpleArray = extraout_XMM0_Qa;
            local_88.m_a = t1;
            ON_Interval::ParameterAt((ON_Interval *)&local_88,local_90);
            iVar7 = (*(pOVar9->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3e])
                              (pOVar9,&local_40,&local_48);
            cVar4 = (char)iVar7;
            iVar2 = local_94;
            if (cVar4 == '\0') {
              if (0.5 < local_90) {
                local_a4 = local_34 + 1;
                if ((int)local_a4 < iVar5) {
                  pOVar9 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[lVar8 + 1];
                }
                else {
                  pOVar9 = (ON_Curve *)0x0;
                }
              }
              iVar2 = local_94 + -1;
            }
          }
          uVar6 = local_a4;
          pOVar10 = pOVar9;
          if (iVar2 == iVar5) {
            cVar4 = '\x01';
            pOVar10 = (ON_Curve *)0x0;
            local_48 = pOVar9;
          }
          if (((int)local_a4 < iVar5) && (cVar4 != '\0')) {
            dVar11 = (double)(long)(int)local_a4;
            (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[(long)dVar11] = (ON_Curve *)0x0;
            local_60._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081ad30;
            local_60.m_a = (ON_Curve **)0x0;
            local_60.m_count = 0;
            local_60.m_capacity = 0;
            if (iVar2 != 0) {
              local_90 = dVar11;
              ON_SimpleArray<ON_Curve_*>::SetCapacity(&local_60,(long)iVar2);
              dVar11 = local_90;
            }
            local_88._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00818f10;
            local_88.m_a = (double *)0x0;
            local_88.m_count = 0;
            local_88.m_capacity = 0;
            if (iVar2 + 1 != 0) {
              ON_SimpleArray<double>::SetCapacity(&local_88,(long)(iVar2 + 1));
            }
            ON_SimpleArray<ON_Curve_*>::Append(&local_60,&local_48);
            ON_SimpleArray<double>::Append(&local_88,&local_b0);
            ON_SimpleArray<ON_Curve_*>::Append
                      (&local_60,iVar5 + ~uVar6,
                       (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a + (long)dVar11 + 1);
            ON_SimpleArray<double>::Append
                      (&local_88,iVar5 + ~uVar6,(this->m_t).m_a + (long)dVar11 + 1);
            iVar5 = local_88.m_count;
            lVar8 = (long)local_88.m_count;
            ON_SimpleArray<ON_Curve_*>::Append
                      (&local_60,uVar6,(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a);
            ON_SimpleArray<double>::Append(&local_88,uVar6,(this->m_t).m_a);
            if (local_40 != (ON_Curve *)0x0) {
              ON_SimpleArray<ON_Curve_*>::Append(&local_60,&local_40);
              ON_SimpleArray<double>::Append(&local_88,(this->m_t).m_a + (long)dVar11);
            }
            ON_SimpleArray<double>::Append(&local_88,&local_b0);
            dVar11 = ON_Interval::Length(&local_70);
            if (iVar5 < local_88.m_count) {
              do {
                local_88.m_a[lVar8] = local_88.m_a[lVar8] + dVar11;
                lVar8 = lVar8 + 1;
              } while (local_88.m_count != lVar8);
            }
            memset((this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a,0,
                   (long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_capacity << 3);
            if (-1 < (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_capacity) {
              (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count = 0;
            }
            ON_SimpleArray<ON_Curve_*>::Append
                      (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_60.m_count,
                       local_60.m_a);
            ON_SimpleArray<double>::operator=(&this->m_t,&local_88);
            if (pOVar10 != (ON_Curve *)0x0) {
              (*(pOVar10->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(pOVar10);
            }
            ON_SimpleArray<double>::~ON_SimpleArray(&local_88);
            ON_SimpleArray<ON_Curve_*>::~ON_SimpleArray(&local_60);
          }
          bVar3 = true;
        }
      }
      if (!bVar3) {
        bVar3 = false;
        goto LAB_0058f3d8;
      }
    }
  }
  bVar3 = true;
  if (cVar4 != '\0') {
    bVar3 = true;
    dVar11 = ON_Interval::Length(&local_70);
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
              (local_a0,dVar11 + local_a0,this);
  }
LAB_0058f3d8:
  if (!bVar3) {
    cVar4 = '\0';
  }
  return (bool)cVar4;
}

Assistant:

bool ON_PolyCurve::ChangeClosedCurveSeam( double t )
{
  bool rc = IsClosed();
  if ( rc )
  {
  	DestroyRuntimeCache();
    rc = false;
    const int old_count = Count();
    const ON_Interval old_dom = Domain();
    ON_Curve* scrv = 0;
    if ( old_count == 1 )
    {
      scrv = SegmentCurve(0);
      if ( scrv )
      {
        ON_Interval sdom = scrv->Domain();
        double s = old_dom.TransformParameterTo(sdom, t);
        rc = scrv->ChangeClosedCurveSeam(s);
        if ( rc )
          SetDomain( t, t + old_dom.Length() );
      }
    }
    else
    {
      double k = t;
      if ( !old_dom.Includes(t) )
      {
        double s = old_dom.NormalizedParameterAt(t);
        s = fmod(s,1.0);
        if ( s < 0.0 )
          s += 1.0;
        k = old_dom.ParameterAt(s);
      }
      if ( old_dom.Includes(k,true) )
      {
        int segment_index = ON_NurbsSpanIndex(2,old_count+1,m_t.Array(),k,0,0);
        scrv = m_segment[segment_index];
        if ( k < m_t[segment_index] )
          return false;
        if ( k >= m_t[segment_index+1] )
          return false;
        int new_count = (k==m_t[segment_index]) ? old_count : old_count+1;
        ON_Curve* sleft = 0;
        ON_Curve* sright = 0;
        if ( new_count > old_count )
        {
					ON_Interval subdom(m_t[segment_index], m_t[segment_index+1]);
					double nt = subdom.NormalizedParameterAt(k);
					ON_Interval Segdom = scrv->Domain();
					double segt = Segdom.ParameterAt(nt);
          rc = scrv->Split( segt, sleft, sright );

//				Greg Arden 6 May 2003. Fixes TRR#10332.  If split fails we break the
//				curve between segments and adjust the parameterization
					if(!rc){
						if(nt>.5){
							segment_index++;
							if(segment_index<old_count)
								scrv = m_segment[segment_index];		
							else
								scrv = nullptr;
						}
						new_count--;
					}
        }
        if(new_count==old_count)
        {
          sright = scrv;
          scrv = 0;
          rc = true;
        }
        if ( rc && segment_index<old_count)
        {
          m_segment[segment_index] = 0;//todo
          ON_SimpleArray<ON_Curve*> new_c(new_count);
          ON_SimpleArray<double> new_t(new_count+1);
          new_c.Append(sright);
          new_t.Append(k);
          new_c.Append( old_count-segment_index-1, m_segment.Array()+segment_index+1);
          new_t.Append( old_count-segment_index-1, m_t.Array()+segment_index+1);
          int j = new_t.Count();
          new_c.Append( segment_index, m_segment.Array() );
          new_t.Append( segment_index, m_t.Array() );
          if ( sleft )
          {
            new_c.Append(sleft);
            new_t.Append(m_t[segment_index]);
          }
          new_t.Append(k);
          double d = old_dom.Length();
          while (j < new_t.Count() )
          {
            new_t[j] += d;
            j++;
          }

          // take care when moving new_c pointers to m_segment
          // so that we don't delete any curves.
          memset( m_segment.Array(), 0, m_segment.Capacity()*sizeof( *m_segment.Array() ) );
          m_segment.SetCount(0);
          m_segment.Append( new_c.Count(), new_c.Array() );
          m_t = new_t;
          if ( scrv )
          {
            delete scrv;
            scrv = 0;
          }
        }
      }
      else
      {
        // k is already the start or  end of the existing curve
        rc = true;
      }
      if ( rc )
        SetDomain( t, t + old_dom.Length() );
    }
  }
  return rc;
}